

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::LowerBailOnInvalidatedArrayLength(Lowerer *this,Instr *instr,bool isInHelperBlock)

{
  OpCode OVar1;
  Func *func;
  Opnd *this_00;
  ArrayRegOpnd *this_01;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  StackSym *pSVar6;
  StackSym *pSVar7;
  RegOpnd *pRVar8;
  Instr *pIVar9;
  Instr *this_02;
  undefined7 in_register_00000011;
  ArrayRegOpnd *this_03;
  LowererMD *this_04;
  undefined1 local_80 [8];
  AutoReuseOpnd autoReuseInvalidatedLengthOpnd;
  AutoReuseOpnd autoReuseLengthBeforeHelperCallOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  bool bStack_40;
  undefined4 uStack_3c;
  ValueType baseValueType;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3494,"(instr)","instr");
    if (!bVar3) goto LAB_005d8afa;
    *puVar5 = 0;
  }
  OVar1 = instr->m_opcode;
  if (((1 < OVar1 - 0x203) && (OVar1 != StElemI_A)) && (OVar1 != StElemI_A_Strict)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3495,
                       "(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy)"
                       ,
                       "instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy"
                      );
    if (!bVar3) goto LAB_005d8afa;
    *puVar5 = 0;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3496,"(instr->GetDst())","instr->GetDst()");
    if (!bVar3) goto LAB_005d8afa;
    *puVar5 = 0;
  }
  OVar4 = IR::Opnd::GetKind(instr->m_dst);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3497,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar3) goto LAB_005d8afa;
    *puVar5 = 0;
  }
  func = instr->m_func;
  this_00 = instr->m_dst;
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar3) goto LAB_005d8afa;
    *puVar5 = 0;
  }
  _bStack_40 = (LabelInstr *)CONCAT44(uStack_3c,(int)CONCAT71(in_register_00000011,isInHelperBlock))
  ;
  this_01 = (ArrayRegOpnd *)this_00[1]._vptr_Opnd;
  local_42 = (this_01->super_RegOpnd).super_Opnd.m_valueType.field_0;
  bVar3 = ValueType::IsNotArray((ValueType *)&local_42.field_0);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x349d,"(!baseValueType.IsNotArray())","!baseValueType.IsNotArray()");
    if (!bVar3) goto LAB_005d8afa;
    *puVar5 = 0;
  }
  bVar3 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)this_01);
  if (bVar3) {
    bVar3 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)this_01);
    this_03 = this_01;
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
      if (!bVar3) {
LAB_005d8afa:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  else {
    this_03 = (ArrayRegOpnd *)0x0;
  }
  autoReuseInvalidatedLengthOpnd.autoDelete = false;
  autoReuseInvalidatedLengthOpnd.wasInUse = false;
  autoReuseInvalidatedLengthOpnd._18_6_ = 0;
  if (this_03 != (ArrayRegOpnd *)0x0) {
    pSVar6 = IR::ArrayRegOpnd::LengthSym(this_03);
    if (pSVar6 != (StackSym *)0x0) {
      pSVar6 = IR::ArrayRegOpnd::LengthSym(this_03);
      if (pSVar6 != this_03->headSegmentLengthSym) {
        pSVar6 = IR::ArrayRegOpnd::LengthSym(this_03);
        pSVar7 = IR::ArrayRegOpnd::LengthSym(this_03);
        pRVar8 = IR::RegOpnd::New(pSVar6,pSVar7->m_type,func);
        IR::AutoReuseOpnd::Initialize
                  ((AutoReuseOpnd *)&autoReuseInvalidatedLengthOpnd.autoDelete,&pRVar8->super_Opnd,
                   func,true);
        goto LAB_005d89f7;
      }
    }
  }
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,(Opnd *)this_01);
  pIVar9 = IR::Instr::New(Call,func);
  pRVar8 = IR::RegOpnd::New(TyUint32,func);
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseInvalidatedLengthOpnd.autoDelete,&pRVar8->super_Opnd,func,
             true);
  IR::Instr::SetDst(pIVar9,&pRVar8->super_Opnd);
  IR::Instr::InsertBefore(instr,pIVar9);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,pIVar9,HelperArray_Jit_GetArrayLength,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
LAB_005d89f7:
  _bStack_40 = IR::Instr::GetOrCreateContinueLabel(instr,bStack_40);
  LowerOneBailOutKind(this,instr,BailOutOnInvalidatedArrayLength,false,false);
  pIVar9 = instr->m_next;
  this_04 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_04,pIVar9,(Opnd *)this_01);
  LowererMD::LoadHelperArgument(this_04,pIVar9,&pRVar8->super_Opnd);
  this_02 = IR::Instr::New(Call,func);
  pRVar8 = IR::RegOpnd::New(TyUint8,func);
  local_80 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_80,&pRVar8->super_Opnd,func,true);
  IR::Instr::SetDst(this_02,&pRVar8->super_Opnd);
  IR::Instr::InsertBefore(pIVar9,this_02);
  LowererMD::ChangeToHelperCall
            (this_04,this_02,HelperArray_Jit_OperationInvalidatedArrayLength,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  InsertTest(&pRVar8->super_Opnd,&pRVar8->super_Opnd,pIVar9);
  InsertBranch(BrEq_A,false,_bStack_40,pIVar9);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_80);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseInvalidatedLengthOpnd.autoDelete);
  return;
}

Assistant:

void Lowerer::LowerBailOnInvalidatedArrayLength(IR::Instr *const instr, const bool isInHelperBlock)
{
    /*
        // Generate checks for whether the length changed during the helper call

        if(!(arrayOpnd && arrayOpnd.LengthSym() && arrayOpnd.LengthSym() != arrayOpnd.HeadSegmentLengthSym()))
        {
            // Record the array length before the helper call
            lengthBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayLength(base)
        }

        helperCall:
            (Helper call and other bailout checks)

        // If the array has a different length after the helper call, then this store needs to bail out
        invalidatedLength = JavascriptArray::Jit_OperationInvalidatedArrayLength(lengthBeforeHelperCall, base)
        test invalidatedLength, invalidatedLength
        jz $skipBailOut

        (Bail out with IR::BailOutOnInvalidatedArrayLength)

        $skipBailOut:
    */

    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy);
    Assert(instr->GetDst());
    Assert(instr->GetDst()->IsIndirOpnd());

    Func *const func = instr->m_func;

    IR::RegOpnd *const baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    Assert(!baseValueType.IsNotArray());
    IR::ArrayRegOpnd *const arrayOpnd = baseOpnd->IsArrayRegOpnd() ? baseOpnd->AsArrayRegOpnd() : nullptr;

    IR::RegOpnd *lengthBeforeHelperCallOpnd;
    IR::AutoReuseOpnd autoReuseLengthBeforeHelperCallOpnd;
    if(arrayOpnd && arrayOpnd->LengthSym() && arrayOpnd->LengthSym() != arrayOpnd->HeadSegmentLengthSym())
    {
        lengthBeforeHelperCallOpnd = IR::RegOpnd::New(arrayOpnd->LengthSym(), arrayOpnd->LengthSym()->GetType(), func);
        autoReuseLengthBeforeHelperCallOpnd.Initialize(lengthBeforeHelperCallOpnd, func);
    }
    else
    {
        // Record the array length before the helper call
        //     lengthBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayLength(base)
        m_lowererMD.LoadHelperArgument(instr, baseOpnd);
        IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
        lengthBeforeHelperCallOpnd = IR::RegOpnd::New(TyUint32, func);
        autoReuseLengthBeforeHelperCallOpnd.Initialize(lengthBeforeHelperCallOpnd, func);
        callInstr->SetDst(lengthBeforeHelperCallOpnd);
        instr->InsertBefore(callInstr);
        m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_GetArrayLength);
    }

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(isInHelperBlock);
    LowerOneBailOutKind(instr, IR::BailOutOnInvalidatedArrayLength, isInHelperBlock);
    IR::Instr *const insertBeforeInstr = instr->m_next;

    // If the array has a different length after the helper call, then this store needs to bail out
    //     invalidatedLength = JavascriptArray::Jit_OperationInvalidatedArrayLength(lengthBeforeHelperCall, base)
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, baseOpnd);
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, lengthBeforeHelperCallOpnd);
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
    IR::RegOpnd *const invalidatedLengthOpnd = IR::RegOpnd::New(TyUint8, func);
    const IR::AutoReuseOpnd autoReuseInvalidatedLengthOpnd(invalidatedLengthOpnd, func);
    callInstr->SetDst(invalidatedLengthOpnd);
    insertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_OperationInvalidatedArrayLength);

    //     test invalidatedLength, invalidatedLength
    //     jz $skipBailOut
    InsertTestBranch(
        invalidatedLengthOpnd,
        invalidatedLengthOpnd,
        Js::OpCode::BrEq_A,
        skipBailOutLabel,
        insertBeforeInstr);

    //     (Bail out with IR::BailOutOnInvalidatedArrayLength)
    //     $skipBailOut:
}